

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleMi<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleMi<4>_>_> *this,PrimRef *prims,
          range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  float fVar3;
  float fVar4;
  ThreadLocal2 *this_00;
  iterator __position;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined4 uVar9;
  __pointer_type pFVar10;
  undefined8 *puVar11;
  ulong uVar12;
  char *pcVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  unsigned_long uVar17;
  PrimRef *pPVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ThreadLocal *pTVar22;
  vuint<4> v0;
  vuint<4> v1;
  vuint<4> geomID;
  vuint<4> v2;
  undefined8 *local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  __pointer_type local_90;
  ThreadLocal2 *local_88;
  undefined8 uStack_80;
  undefined8 *local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ThreadLocal2 *local_68;
  undefined8 uStack_60;
  ulong local_50;
  float local_48 [4];
  ThreadLocal *local_38;
  
  uVar17 = set->_begin;
  local_98 = (set->_end - uVar17) + 3;
  local_50 = local_98 >> 2;
  local_78 = (undefined8 *)(local_50 * 0x50);
  local_90 = alloc->alloc;
  pTVar22 = alloc->talloc1;
  this_00 = pTVar22->parent;
  if (local_90 != (this_00->alloc)._M_b._M_p) {
    uStack_80 = CONCAT71(uStack_80._1_7_,1);
    local_88 = this_00;
    local_38 = pTVar22;
    MutexSys::lock(&this_00->mutex);
    pFVar10 = local_90;
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (local_90 == (__pointer_type)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = local_90->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = local_90->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = local_90;
    UNLOCK();
    local_a8 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_a0 = CONCAT71(uStack_a0._1_7_,1);
    local_68 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pFVar10->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pFVar10->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&pFVar10->thread_local_allocators,__position,&local_68);
    }
    else {
      *__position._M_current = this_00;
      pppTVar2 = &(pFVar10->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    pTVar22 = local_38;
    if ((char)uStack_80 == '\x01') {
      MutexSys::unlock(&local_88->mutex);
    }
  }
  puVar11 = local_78;
  pTVar22->bytesUsed = pTVar22->bytesUsed + (long)local_78;
  sVar14 = pTVar22->cur;
  uVar15 = (ulong)(-(int)sVar14 & 0xf);
  uVar12 = (long)local_78 + uVar15 + sVar14;
  pTVar22->cur = uVar12;
  if (pTVar22->end < uVar12) {
    pTVar22->cur = sVar14;
    puVar8 = (undefined8 *)pTVar22->allocBlockSize;
    if ((undefined8 *)((long)local_78 * 4) < puVar8 || (long)local_78 * 4 - (long)puVar8 == 0) {
      local_a8 = puVar8;
      pcVar13 = (char *)FastAllocator::malloc(local_90,(size_t)&local_a8);
      pTVar22->ptr = pcVar13;
      sVar14 = (pTVar22->end - pTVar22->cur) + pTVar22->bytesWasted;
      pTVar22->bytesWasted = sVar14;
      pTVar22->end = (size_t)local_a8;
      pTVar22->cur = (size_t)puVar11;
      if (local_a8 < puVar11) {
        pTVar22->cur = 0;
        local_a8 = (undefined8 *)pTVar22->allocBlockSize;
        pcVar13 = (char *)FastAllocator::malloc(local_90,(size_t)&local_a8);
        pTVar22->ptr = pcVar13;
        sVar14 = (pTVar22->end - pTVar22->cur) + pTVar22->bytesWasted;
        pTVar22->bytesWasted = sVar14;
        pTVar22->end = (size_t)local_a8;
        pTVar22->cur = (size_t)puVar11;
        if (local_a8 < puVar11) {
          pTVar22->cur = 0;
          pcVar13 = (char *)0x0;
        }
        else {
          pTVar22->bytesWasted = sVar14;
        }
      }
      else {
        pTVar22->bytesWasted = sVar14;
      }
    }
    else {
      pcVar13 = (char *)FastAllocator::malloc(local_90,(size_t)&local_78);
    }
  }
  else {
    pTVar22->bytesWasted = pTVar22->bytesWasted + uVar15;
    pcVar13 = pTVar22->ptr + (uVar12 - (long)local_78);
  }
  if (3 < local_98) {
    lVar16 = 0;
    do {
      uVar12 = set->_end;
      pSVar5 = ((this->createLeafFunc).bvh)->scene;
      local_a8 = (undefined8 *)0x0;
      uStack_a0 = 0;
      local_88 = (ThreadLocal2 *)0x0;
      uStack_80 = 0;
      local_68 = (ThreadLocal2 *)0x0;
      uStack_60 = 0;
      local_78 = (undefined8 *)0xffffffffffffffff;
      uStack_70 = 0xffffffff;
      uStack_6c = 0xffffffff;
      local_48[0] = -NAN;
      local_48[1] = -NAN;
      local_48[2] = -NAN;
      local_48[3] = -NAN;
      pPVar18 = prims + uVar17;
      lVar19 = 0;
      do {
        if (uVar17 < uVar12) {
          fVar3 = (pPVar18->lower).field_0.m128[3];
          *(float *)((long)&local_78 + lVar19) = fVar3;
          fVar4 = (pPVar18->upper).field_0.m128[3];
          *(float *)((long)local_48 + lVar19) = fVar4;
          pGVar6 = (pSVar5->geometries).items[(uint)fVar3].ptr;
          lVar7 = *(long *)&pGVar6->field_0x58;
          lVar21 = (ulong)(uint)fVar4 *
                   pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar20 = *(uint *)&pGVar6[1].intersectionFilterN >> 2;
          *(uint *)((long)&local_a8 + lVar19) = *(int *)(lVar7 + lVar21) * uVar20;
          *(uint *)((long)&local_88 + lVar19) = *(int *)(lVar7 + 4 + lVar21) * uVar20;
          *(uint *)((long)&local_68 + lVar19) = uVar20 * *(int *)(lVar7 + 8 + lVar21);
          uVar17 = uVar17 + 1;
        }
        else if (lVar19 != 0) {
          *(undefined4 *)((long)&local_78 + lVar19) = local_78._0_4_;
          *(undefined4 *)((long)local_48 + lVar19) = 0xffffffff;
          uVar9 = local_a8._0_4_;
          *(undefined4 *)((long)&local_a8 + lVar19) = local_a8._0_4_;
          *(undefined4 *)((long)&local_88 + lVar19) = uVar9;
          *(undefined4 *)((long)&local_68 + lVar19) = uVar9;
        }
        if (uVar17 < uVar12) {
          pPVar18 = prims + uVar17;
        }
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x10);
      lVar19 = lVar16 * 0x50;
      *(undefined8 **)(pcVar13 + lVar19) = local_a8;
      *(undefined8 *)(pcVar13 + lVar19 + 8) = uStack_a0;
      *(ThreadLocal2 **)(pcVar13 + lVar19 + 0x10) = local_88;
      *(undefined8 *)(pcVar13 + lVar19 + 0x10 + 8) = uStack_80;
      *(ThreadLocal2 **)(pcVar13 + lVar19 + 0x20) = local_68;
      *(undefined8 *)(pcVar13 + lVar19 + 0x20 + 8) = uStack_60;
      *(undefined8 **)(pcVar13 + lVar19 + 0x30) = local_78;
      *(ulong *)(pcVar13 + lVar19 + 0x30 + 8) = CONCAT44(uStack_6c,uStack_70);
      *(ulong *)(pcVar13 + lVar19 + 0x40) = CONCAT44(local_48[1],local_48[0]);
      *(ulong *)(pcVar13 + lVar19 + 0x40 + 8) = CONCAT44(local_48[3],local_48[2]);
      lVar16 = lVar16 + 1;
    } while (lVar16 != local_50 + (local_50 == 0));
  }
  uVar12 = 7;
  if (local_50 < 7) {
    uVar12 = local_50;
  }
  return (NodeRef)(uVar12 | (ulong)pcVar13 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }